

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_functions.hpp
# Opt level: O2

void so_5::impl::instantiator_and_sender_base<so_5::stats::messages::distribution_finished,_false>::
     send<>(mbox_t *to)

{
  abstract_message_box_t *this;
  distribution_finished *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_so_5::stats::messages::distribution_finished_*,_false> local_18;
  
  this = to->m_obj;
  local_18._M_head_impl = in_RAX;
  details::make_message_instance_impl<false,_so_5::stats::messages::distribution_finished>::make<>()
  ;
  abstract_message_box_t::deliver_message<so_5::stats::messages::distribution_finished>
            (this,(type_index)&stats::messages::distribution_finished::typeinfo,
             (unique_ptr<so_5::stats::messages::distribution_finished,_std::default_delete<so_5::stats::messages::distribution_finished>_>
              *)&local_18,immutable_message);
  if (local_18._M_head_impl != (distribution_finished *)0x0) {
    (*((local_18._M_head_impl)->super_message_t)._vptr_message_t[1])();
  }
  return;
}

Assistant:

void
send( TARGET && to, ARGS&&... args )
	{
		so_5::impl::instantiator_and_sender< MESSAGE >::send(
				send_functions_details::arg_to_mbox( std::forward<TARGET>(to) ),
				std::forward<ARGS>(args)... );
	}